

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GamepadInputHandler_glfw.cpp
# Opt level: O2

int __thiscall
GamepadInputHandler::poll(GamepadInputHandler *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  int iVar1;
  GamepadState local_78;
  undefined1 uStack_39;
  undefined1 local_38 [8];
  GLFWgamepadstate glfwState;
  
  iVar1 = glfwGetGamepadState((uint)this->_gamepadIndex,(GLFWgamepadstate *)local_38);
  if (iVar1 != 0) {
    iVar1 = (int)local_38._0_7_;
    *(ulong *)(this->_currentState).buttons = CONCAT17(local_38[7],local_38._0_7_);
    *(ulong *)((this->_currentState).buttons + 8) = CONCAT17(uStack_39,glfwState.buttons._0_7_);
    (this->_currentState).analog[0] = (float)glfwState.buttons._8_4_;
    (this->_currentState).analog[1] = -(float)glfwState._12_4_;
    (this->_currentState).analog[2] = glfwState.axes[0];
    (this->_currentState).analog[3] = -glfwState.axes[1];
    (this->_currentState).analog[4] = (glfwState.axes[2] + 1.0) * 0.5;
    (this->_currentState).analog[5] = (glfwState.axes[3] + 1.0) * 0.5;
    if ((this->_rawCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
      local_78.analog._16_8_ = *(undefined8 *)((this->_currentState).analog + 4);
      local_78.buttons._0_8_ = *(undefined8 *)(this->_currentState).buttons;
      local_78._8_8_ = *(undefined8 *)((this->_currentState).buttons + 8);
      local_78.analog._0_8_ = *(undefined8 *)(this->_currentState).analog;
      local_78.analog._8_8_ = *(undefined8 *)((this->_currentState).analog + 2);
      iVar1 = (*(this->_rawCallback)._M_invoker)((_Any_data *)&this->_rawCallback,&local_78);
    }
  }
  return iVar1;
}

Assistant:

void GamepadInputHandler::poll() {
    // Get the GLFW gamepad state
    GLFWgamepadstate glfwState;
    if (glfwGetGamepadState(_gamepadIndex, &glfwState)) {
        // Convert to GLEX state format
        GamepadState glexState;
        std::memcpy(glexState.buttons, glfwState.buttons, sizeof(unsigned char) * (GamepadButton::LAST + 1));

        glexState.analog[GamepadAnalog::L_STICK_X] = glfwState.axes[GamepadAnalog::L_STICK_X];
        glexState.analog[GamepadAnalog::R_STICK_X] = glfwState.axes[GamepadAnalog::R_STICK_X];

        // Invert L and R sticks Y-axis so that up is positive
        glexState.analog[GamepadAnalog::L_STICK_Y] = -(glfwState.axes[GamepadAnalog::L_STICK_Y]);
        glexState.analog[GamepadAnalog::R_STICK_Y] = -(glfwState.axes[GamepadAnalog::R_STICK_Y]);
        
        // Convert L and R triggers to 0.0 - 1.0 range
        glexState.analog[GamepadAnalog::L_TRIGGER] = (glfwState.axes[GamepadAnalog::L_TRIGGER] + 1.0) / 2.0;
        glexState.analog[GamepadAnalog::R_TRIGGER] = (glfwState.axes[GamepadAnalog::R_TRIGGER] + 1.0) / 2.0;

        _currentState = glexState;

        // Call the raw state callback if it exists
        if (_rawCallback) {
            _rawCallback(_currentState);
        }
    }
}